

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intmem.h
# Opt level: O0

char intmem::loadu_le<signed_char>(uint8_t *Ptr)

{
  char cVar1;
  uint8_t *Ptr_local;
  
  cVar1 = loadu<signed_char>(Ptr);
  cVar1 = bswap_le<signed_char>(cVar1);
  return cVar1;
}

Assistant:

static INTMEM_CE T loadu_le(const uint8_t* Ptr)
{
#ifdef INTMEM_CPP20_SUPPORT
  if (std::is_constant_evaluated()) {
    T Ret = 0;
    for (size_t I = 0; I < sizeof(T); ++I) {
      Ret |= ((T)(Ptr[I])) << (I*8);
    }
    return Ret;
  }
#endif
  return bswap_le(loadu<T>(Ptr));
}